

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode parse_authority(Curl_URL *u,char *auth,size_t authlen,uint flags,dynbuf *host,
                         _Bool has_scheme)

{
  char *pcVar1;
  CURLcode CVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  CURLUcode local_4c;
  CURLcode result;
  CURLUcode uc;
  size_t offset;
  dynbuf *pdStack_38;
  _Bool has_scheme_local;
  dynbuf *host_local;
  size_t sStack_28;
  uint flags_local;
  size_t authlen_local;
  char *auth_local;
  Curl_URL *u_local;
  
  offset._7_1_ = has_scheme;
  pdStack_38 = host;
  host_local._4_4_ = flags;
  sStack_28 = authlen;
  authlen_local = (size_t)auth;
  auth_local = (char *)u;
  local_4c = parse_hostname_login(u,auth,authlen,flags,(size_t *)&result);
  if (local_4c == CURLUE_OK) {
    CVar2 = Curl_dyn_addn(pdStack_38,(void *)(authlen_local + _result),sStack_28 - _result);
    if (CVar2 == CURLE_OK) {
      local_4c = Curl_parse_port((Curl_URL *)auth_local,pdStack_38,(_Bool)(offset._7_1_ & 1));
      if (local_4c == CURLUE_OK) {
        sVar4 = Curl_dyn_len(pdStack_38);
        if (sVar4 == 0) {
          return CURLUE_NO_HOST;
        }
        iVar3 = ipv4_normalize(pdStack_38);
        pcVar1 = auth_local;
        switch(iVar3) {
        default:
          local_4c = CURLUE_BAD_HOSTNAME;
          break;
        case 1:
          local_4c = urldecode_host(pdStack_38);
          pcVar1 = auth_local;
          if (local_4c == CURLUE_OK) {
            pcVar5 = Curl_dyn_ptr(pdStack_38);
            sVar4 = Curl_dyn_len(pdStack_38);
            local_4c = hostname_check((Curl_URL *)pcVar1,pcVar5,sVar4);
          }
          break;
        case 2:
          break;
        case 3:
          pcVar5 = Curl_dyn_ptr(pdStack_38);
          sVar4 = Curl_dyn_len(pdStack_38);
          local_4c = ipv6_parse((Curl_URL *)pcVar1,pcVar5,sVar4);
          break;
        case -1:
          local_4c = CURLUE_OUT_OF_MEMORY;
        }
      }
    }
    else {
      local_4c = CURLUE_OUT_OF_MEMORY;
      if (CVar2 == CURLE_TOO_LARGE) {
        local_4c = CURLUE_TOO_LARGE;
      }
    }
  }
  return local_4c;
}

Assistant:

static CURLUcode parse_authority(struct Curl_URL *u,
                                 const char *auth, size_t authlen,
                                 unsigned int flags,
                                 struct dynbuf *host,
                                 bool has_scheme)
{
  size_t offset;
  CURLUcode uc;
  CURLcode result;

  /*
   * Parse the login details and strip them out of the hostname.
   */
  uc = parse_hostname_login(u, auth, authlen, flags, &offset);
  if(uc)
    goto out;

  result = Curl_dyn_addn(host, auth + offset, authlen - offset);
  if(result) {
    uc = cc2cu(result);
    goto out;
  }

  uc = Curl_parse_port(u, host, has_scheme);
  if(uc)
    goto out;

  if(!Curl_dyn_len(host))
    return CURLUE_NO_HOST;

  switch(ipv4_normalize(host)) {
  case HOST_IPV4:
    break;
  case HOST_IPV6:
    uc = ipv6_parse(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_NAME:
    uc = urldecode_host(host);
    if(!uc)
      uc = hostname_check(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_ERROR:
    uc = CURLUE_OUT_OF_MEMORY;
    break;
  default:
    uc = CURLUE_BAD_HOSTNAME; /* Bad IPv4 address even */
    break;
  }

out:
  return uc;
}